

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall kratos::Simulator::process_stmt(Simulator *this,IfStmt *if_,Var *var)

{
  optional<unsigned_long> oVar1;
  undefined1 local_38 [8];
  shared_ptr<kratos::Var> target;
  
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_38,
             &(if_->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  oVar1 = get_value_(this,(Var *)local_38);
  if ((oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged &
      oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload != 0) == 1) {
    process_stmt(this,&((if_->then_body_).
                        super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_StmtBlock,var);
  }
  else {
    process_stmt(this,&((if_->else_body_).
                        super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_StmtBlock,var);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&target);
  return;
}

Assistant:

void Simulator::process_stmt(kratos::IfStmt *if_, const Var *var) {
    auto target = if_->predicate();
    auto val = get_value_(target.get());
    if (val && (*val)) {
        auto const &then_ = if_->then_body();
        process_stmt(then_.get(), var);
    } else {
        auto const &else_ = if_->else_body();
        process_stmt(else_.get(), var);
    }
}